

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O3

int32_t ucnv_MBCSFromUChar32_63
                  (UConverterSharedData *sharedData,UChar32 c,uint32_t *pValue,UBool useFallback)

{
  uint8_t uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  int32_t *cx;
  int32_t iVar4;
  
  if ((c < 0x10000) || (((sharedData->mbcs).unicodeMask & 1) != 0)) {
    puVar3 = (sharedData->mbcs).fromUnicodeTable;
    uVar1 = (sharedData->mbcs).outputType;
    if (uVar1 == '\x01') {
      uVar2 = *(ushort *)
               ((sharedData->mbcs).fromUnicodeBytes +
               (ulong)((*(uint *)(puVar3 + (ulong)((uint)puVar3[c >> 10] + ((uint)c >> 4 & 0x3f)) *
                                           2) & 0xffff) << 4 | c & 0xfU) * 2);
      if ((((*(uint *)(puVar3 + (ulong)((uint)puVar3[c >> 10] + ((uint)c >> 4 & 0x3f)) * 2) >>
            (sbyte)(c & 0xfU)) >> 0x10 & 1) != 0) ||
         (((c - 0xe000U < 0x1900 || useFallback != '\0' || (c - 0xf0000U < 0x20000)) && (uVar2 != 0)
          ))) {
        *pValue = (uint)uVar2;
        return 2 - (uint)(uVar2 < 0x100);
      }
    }
    else {
      if (uVar1 != '\0') {
        return -1;
      }
      uVar2 = *(ushort *)
               ((sharedData->mbcs).fromUnicodeBytes +
               (ulong)((c & 0xfU) + (uint)puVar3[((uint)c >> 4 & 0x3f) + (uint)puVar3[c >> 10]]) * 2
               );
      if (useFallback == '\0') {
        if (0xbff < uVar2) goto LAB_002ca718;
      }
      else if (0x7ff < uVar2) {
LAB_002ca718:
        *pValue = (uint)(byte)uVar2;
        return 1;
      }
    }
  }
  cx = (sharedData->mbcs).extIndexes;
  if (cx != (int32_t *)0x0) {
    iVar4 = ucnv_extSimpleMatchFromU_63(cx,c,pValue,useFallback);
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    return iVar4;
  }
  return 0;
}

Assistant:

U_CFUNC int32_t
ucnv_MBCSFromUChar32(UConverterSharedData *sharedData,
                 UChar32 c, uint32_t *pValue,
                 UBool useFallback) {
    const int32_t *cx;
    const uint16_t *table;
#if 0
/* #if 0 because this is not currently used in ICU - reduce code, increase code coverage */
    const uint8_t *p;
#endif
    uint32_t stage2Entry;
    uint32_t value;
    int32_t length;

    /* BMP-only codepages are stored without stage 1 entries for supplementary code points */
    if(c<=0xffff || (sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY)) {
        table=sharedData->mbcs.fromUnicodeTable;

        /* convert the Unicode code point in c into codepage bytes (same as in _MBCSFromUnicodeWithOffsets) */
        if(sharedData->mbcs.outputType==MBCS_OUTPUT_1) {
            value=MBCS_SINGLE_RESULT_FROM_U(table, (uint16_t *)sharedData->mbcs.fromUnicodeBytes, c);
            /* is this code point assigned, or do we use fallbacks? */
            if(useFallback ? value>=0x800 : value>=0xc00) {
                *pValue=value&0xff;
                return 1;
            }
        } else /* outputType!=MBCS_OUTPUT_1 */ {
            stage2Entry=MBCS_STAGE_2_FROM_U(table, c);

            /* get the bytes and the length for the output */
            switch(sharedData->mbcs.outputType) {
            case MBCS_OUTPUT_2:
                value=MBCS_VALUE_2_FROM_STAGE_2(sharedData->mbcs.fromUnicodeBytes, stage2Entry, c);
                if(value<=0xff) {
                    length=1;
                } else {
                    length=2;
                }
                break;
#if 0
/* #if 0 because this is not currently used in ICU - reduce code, increase code coverage */
            case MBCS_OUTPUT_DBCS_ONLY:
                /* table with single-byte results, but only DBCS mappings used */
                value=MBCS_VALUE_2_FROM_STAGE_2(sharedData->mbcs.fromUnicodeBytes, stage2Entry, c);
                if(value<=0xff) {
                    /* no mapping or SBCS result, not taken for DBCS-only */
                    value=stage2Entry=0; /* stage2Entry=0 to reset roundtrip flags */
                    length=0;
                } else {
                    length=2;
                }
                break;
            case MBCS_OUTPUT_3:
                p=MBCS_POINTER_3_FROM_STAGE_2(sharedData->mbcs.fromUnicodeBytes, stage2Entry, c);
                value=((uint32_t)*p<<16)|((uint32_t)p[1]<<8)|p[2];
                if(value<=0xff) {
                    length=1;
                } else if(value<=0xffff) {
                    length=2;
                } else {
                    length=3;
                }
                break;
            case MBCS_OUTPUT_4:
                value=MBCS_VALUE_4_FROM_STAGE_2(sharedData->mbcs.fromUnicodeBytes, stage2Entry, c);
                if(value<=0xff) {
                    length=1;
                } else if(value<=0xffff) {
                    length=2;
                } else if(value<=0xffffff) {
                    length=3;
                } else {
                    length=4;
                }
                break;
            case MBCS_OUTPUT_3_EUC:
                value=MBCS_VALUE_2_FROM_STAGE_2(sharedData->mbcs.fromUnicodeBytes, stage2Entry, c);
                /* EUC 16-bit fixed-length representation */
                if(value<=0xff) {
                    length=1;
                } else if((value&0x8000)==0) {
                    value|=0x8e8000;
                    length=3;
                } else if((value&0x80)==0) {
                    value|=0x8f0080;
                    length=3;
                } else {
                    length=2;
                }
                break;
            case MBCS_OUTPUT_4_EUC:
                p=MBCS_POINTER_3_FROM_STAGE_2(sharedData->mbcs.fromUnicodeBytes, stage2Entry, c);
                value=((uint32_t)*p<<16)|((uint32_t)p[1]<<8)|p[2];
                /* EUC 16-bit fixed-length representation applied to the first two bytes */
                if(value<=0xff) {
                    length=1;
                } else if(value<=0xffff) {
                    length=2;
                } else if((value&0x800000)==0) {
                    value|=0x8e800000;
                    length=4;
                } else if((value&0x8000)==0) {
                    value|=0x8f008000;
                    length=4;
                } else {
                    length=3;
                }
                break;
#endif
            default:
                /* must not occur */
                return -1;
            }

            /* is this code point assigned, or do we use fallbacks? */
            if( MBCS_FROM_U_IS_ROUNDTRIP(stage2Entry, c) ||
                (FROM_U_USE_FALLBACK(useFallback, c) && value!=0)
            ) {
                /*
                 * We allow a 0 byte output if the "assigned" bit is set for this entry.
                 * There is no way with this data structure for fallback output
                 * to be a zero byte.
                 */
                /* assigned */
                *pValue=value;
                return length;
            }
        }
    }

    cx=sharedData->mbcs.extIndexes;
    if(cx!=NULL) {
        length=ucnv_extSimpleMatchFromU(cx, c, pValue, useFallback);
        return length>=0 ? length : -length;  /* return abs(length); */
    }

    /* unassigned */
    return 0;
}